

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D_x86_avx512::forward
          (DeformableConv2D_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  Mat *this_00;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  uint _w;
  int iVar8;
  int iVar9;
  _func_int *p_Var10;
  int *piVar11;
  int iVar12;
  long lVar13;
  int _h;
  int _h_00;
  float *pfVar14;
  int iVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  int iVar20;
  long lVar21;
  void *pvVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar35;
  float fVar36;
  undefined1 auVar34 [16];
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  Mat local_258;
  ulong local_208;
  ulong local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  _func_int **local_1e8;
  pointer local_1e0;
  Mat local_1d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_188;
  Mat *local_180;
  ulong local_178;
  long local_170;
  void *local_168;
  long local_160;
  long local_158;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_150;
  void *local_148;
  pointer local_140;
  void *local_138;
  DeformableConv2D_x86_avx512 *local_130;
  long local_128;
  long local_120;
  _func_int **local_118;
  _func_int **local_110;
  Mat local_108;
  Mat local_c0;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1e0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_208 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  p_Var10 = this->_vptr_DeformableConv2D_x86_avx512[-3];
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  iVar9 = (~((*(int *)(&this->field_0xd4 + (long)p_Var10) + -1) *
            *(int *)(&this->field_0xdc + (long)p_Var10)) + pMVar3->w +
           *(int *)(&this->field_0xec + (long)p_Var10) + *(int *)(&this->field_0xf0 + (long)p_Var10)
          ) / *(int *)(&this->field_0xe4 + (long)p_Var10);
  uVar6 = (long)(~((*(int *)(&this->field_0xd8 + (long)p_Var10) + -1) *
                  *(int *)(&this->field_0xe0 + (long)p_Var10)) + iVar1 +
                 *(int *)(&this->field_0xf4 + (long)p_Var10) +
                *(int *)(&this->field_0xf8 + (long)p_Var10)) /
          (long)*(int *)(&this->field_0xe8 + (long)p_Var10);
  local_1d8.cstep = 0;
  _w = iVar9 + 1;
  _h = (int)uVar6 + 1;
  _h_00 = _h * _w;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize._0_4_ = 0;
  local_1d8.elemsize._4_4_ = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  local_150 = bottom_blobs;
  Mat::create(&local_1d8,
              *(int *)(&this->field_0xd8 + (long)p_Var10) * iVar2 *
              *(int *)(&this->field_0xd4 + (long)p_Var10) * _h_00,_elemsize,opt->blob_allocator);
  iVar8 = -100;
  if ((local_1d8.data != (void *)0x0) && ((long)local_1d8.c * local_1d8.cstep != 0)) {
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_200 = uVar6 & 0xffffffff;
    Mat::create(this_00,*(int *)(&this->field_0xd0 +
                                (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),_h_00,_elemsize,
                opt->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar15 = iVar1 * (int)local_208;
      local_188 = top_blobs;
      local_180 = this_00;
      Mat::reshape(&local_78,pMVar3,iVar15 * iVar2,(Allocator *)0x0);
      Mat::reshape(&local_c0,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      local_1e0 = (pointer)((long)local_1e0 - (long)pMVar3);
      local_138 = local_c0.data;
      local_168 = local_1d8.data;
      iVar8 = (int)local_208;
      local_1f0 = iVar8 + -1;
      local_1f4 = 0;
      if (0 < iVar2) {
        local_1f4 = iVar2;
      }
      local_158 = (long)iVar9;
      local_178 = (ulong)_w;
      local_170 = (long)(int)local_200;
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      local_148 = local_78.data;
      lVar13 = 0;
      while (lVar21 = lVar13, lVar21 <= local_170) {
        local_1e8 = this->_vptr_DeformableConv2D_x86_avx512;
        local_160 = lVar21 * local_178;
        lVar13 = 0;
        while (lVar24 = lVar13, lVar24 <= local_158) {
          p_Var10 = local_1e8[-3];
          uVar23 = (uint)lVar24;
          iVar20 = (int)lVar21;
          auVar7 = vpinsrd_avx(ZEXT416(uVar23),iVar20,1);
          auVar41 = vpinsrd_avx(ZEXT416(*(uint *)(&this->field_0xec + (long)p_Var10)),
                                *(undefined4 *)(&this->field_0xf4 + (long)p_Var10),1);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(&this->field_0xe4 + (long)p_Var10);
          auVar7 = vpmulld_avx(auVar32,auVar7);
          auVar7 = vpsubd_avx(auVar7,auVar41);
          pfVar14 = (float *)((long)local_1d8.data +
                             (long)(int)(((int)local_160 + uVar23) * iVar2 *
                                         *(int *)(&this->field_0xd8 + (long)p_Var10) *
                                        *(int *)(&this->field_0xd4 + (long)p_Var10)) * 4);
          local_110 = this->_vptr_DeformableConv2D_x86_avx512;
          iVar9 = 0;
          while (iVar17 = iVar9, iVar17 < *(int *)(&this->field_0xd8 + (long)p_Var10)) {
            local_140 = (local_150->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            local_118 = this->_vptr_DeformableConv2D_x86_avx512;
            for (uVar26 = 0; (int)uVar26 < *(int *)(&this->field_0xd4 + (long)local_110[-3]);
                uVar26 = uVar26 + 1) {
              iVar9 = *(int *)(&this->field_0xd4 + (long)local_110[-3]) * iVar17 + uVar26;
              fVar31 = 1.0;
              if (local_1e0 == (pointer)0xd8) {
                fVar31 = *(float *)((long)local_140[2].data +
                                   lVar24 * 4 +
                                   local_140[2].w * lVar21 * local_140[2].elemsize +
                                   (long)iVar9 * local_140[2].cstep * local_140[2].elemsize);
              }
              auVar32 = vinsertps_avx(ZEXT416(*(uint *)((long)local_c0.data +
                                                       (long)(int)(((iVar9 * 2 + 1) * _h + iVar20) *
                                                                   _w + uVar23) * 4)),
                                      ZEXT416(*(uint *)((long)local_c0.data +
                                                       (long)(int)((iVar9 * 2 * _h + iVar20) * _w +
                                                                  uVar23) * 4)),0x10);
              auVar41 = vpinsrd_avx(ZEXT416(uVar26),iVar17,1);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)(&this->field_0xdc + (long)local_118[-3]);
              auVar41 = vpmulld_avx(auVar39,auVar41);
              auVar41 = vpaddd_avx(auVar41,auVar7);
              auVar41 = vcvtdq2ps_avx(auVar41);
              auVar34._0_4_ = auVar41._0_4_ + auVar32._0_4_;
              auVar34._4_4_ = auVar41._4_4_ + auVar32._4_4_;
              auVar34._8_4_ = auVar41._8_4_ + auVar32._8_4_;
              auVar34._12_4_ = auVar41._12_4_ + auVar32._12_4_;
              auVar41 = vmovshdup_avx(auVar34);
              fVar38 = auVar41._0_4_;
              local_200 = CONCAT44(local_200._4_4_,uVar26);
              pvVar22 = local_78.data;
              iVar9 = local_1f4;
              if ((float)iVar8 <= auVar34._0_4_ ||
                  (((float)iVar1 <= fVar38 || auVar34._0_4_ <= -1.0) || fVar38 <= -1.0)) {
                fVar33 = 0.0;
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                auVar32 = ZEXT816(0) << 0x20;
                bVar29 = false;
                auVar41 = (undefined1  [16])0x0;
                bVar19 = false;
                bVar28 = false;
                bVar16 = false;
                lVar25 = 0;
                lVar27 = 0;
                lVar13 = 0;
                lVar18 = 0;
              }
              else {
                auVar41 = vroundps_avx(auVar34,9);
                auVar40._0_4_ = (uint)auVar41._0_4_;
                auVar40._4_4_ = (uint)auVar41._4_4_;
                auVar40._8_4_ = (int)auVar41._8_4_;
                auVar40._12_4_ = (int)auVar41._12_4_;
                auVar41 = vcvtdq2ps_avx(auVar40);
                auVar41 = vsubps_avx(auVar34,auVar41);
                auVar32 = vsubps_avx(auVar30,auVar41);
                bVar4 = (int)auVar40._0_4_ < local_1f0;
                bVar19 = -1 < (int)auVar40._4_4_ && bVar4;
                bVar5 = (int)auVar40._4_4_ < iVar1 + -1;
                bVar28 = -1 < (int)auVar40._0_4_ && bVar5;
                bVar16 = bVar5 && bVar4;
                bVar29 = -1 < (int)(auVar40._4_4_ | auVar40._0_4_);
                lVar25 = (long)(int)(iVar8 * auVar40._4_4_ + auVar40._0_4_);
                if (!bVar29) {
                  lVar25 = 0;
                }
                lVar27 = (long)(int)(auVar40._0_4_ + iVar8 * auVar40._4_4_ + 1);
                if (-1 >= (int)auVar40._4_4_ || !bVar4) {
                  lVar27 = 0;
                }
                iVar12 = (auVar40._4_4_ + 1) * iVar8;
                lVar13 = (long)(int)(auVar40._0_4_ + iVar12);
                if (-1 >= (int)auVar40._0_4_ || !bVar5) {
                  lVar13 = 0;
                }
                lVar18 = (long)(int)(iVar12 + auVar40._0_4_ + 1);
                if (!bVar5 || !bVar4) {
                  lVar18 = 0;
                }
                auVar39 = vblendps_avx(auVar41,auVar32,2);
                auVar39 = vshufps_avx(auVar39,auVar39,0xe1);
                fVar33 = auVar32._0_4_ * auVar39._0_4_;
                fVar35 = auVar32._4_4_ * auVar39._4_4_;
                fVar36 = auVar32._8_4_ * auVar39._8_4_;
                fVar37 = auVar32._12_4_ * auVar39._12_4_;
                auVar39 = vmovshdup_avx(auVar41);
                auVar32 = ZEXT416((uint)(auVar32._0_4_ * auVar39._0_4_));
                auVar41 = ZEXT416((uint)(auVar41._0_4_ * auVar39._0_4_));
              }
              while (iVar9 != 0) {
                auVar39 = ZEXT816(0) << 0x40;
                if ((float)iVar8 > auVar34._0_4_ &&
                    (((float)iVar1 > fVar38 && auVar34._0_4_ > -1.0) && fVar38 > -1.0)) {
                  auVar40 = ZEXT816(0) << 0x40;
                  auVar42 = ZEXT816(0) << 0x40;
                  if (bVar29) {
                    auVar42 = ZEXT416(*(uint *)((long)pvVar22 + lVar25 * 4));
                  }
                  if (bVar19) {
                    auVar40 = ZEXT416(*(uint *)((long)pvVar22 + lVar27 * 4));
                  }
                  auVar43 = ZEXT816(0) << 0x40;
                  if (bVar28) {
                    auVar39 = ZEXT416(*(uint *)((long)pvVar22 + lVar13 * 4));
                  }
                  if (bVar16) {
                    auVar43 = ZEXT416(*(uint *)((long)pvVar22 + lVar18 * 4));
                  }
                  auVar40 = vinsertps_avx(auVar42,auVar40,0x10);
                  auVar42._0_4_ = auVar40._0_4_ * fVar33;
                  auVar42._4_4_ = auVar40._4_4_ * fVar35;
                  auVar42._8_4_ = auVar40._8_4_ * fVar36;
                  auVar42._12_4_ = auVar40._12_4_ * fVar37;
                  auVar40 = vhaddps_avx(auVar42,auVar42);
                  auVar39 = vfmadd213ss_fma(auVar39,auVar32,auVar40);
                  auVar39 = vfmadd231ss_fma(auVar39,auVar41,auVar43);
                }
                *pfVar14 = auVar39._0_4_ * fVar31;
                pfVar14 = pfVar14 + 1;
                pvVar22 = (void *)((long)pvVar22 + (long)iVar15 * 4);
                iVar9 = iVar9 + -1;
              }
            }
            p_Var10 = local_1e8[-3];
            local_1ec = iVar17;
            iVar9 = iVar17 + 1;
          }
          local_120 = lVar24;
          lVar13 = lVar24 + 1;
        }
        local_128 = lVar21;
        lVar13 = lVar21 + 1;
      }
      local_130 = this;
      Mat::reshape(&local_258,&local_1d8,
                   iVar2 * *(int *)(&this->field_0xd8 +
                                   (long)this->_vptr_DeformableConv2D_x86_avx512[-3]) *
                   *(int *)(&this->field_0xd4 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),
                   _h_00,(Allocator *)0x0);
      piVar11 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      piVar11 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar11 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      local_1d8.data = local_258.data;
      local_1d8.refcount._0_4_ = local_258.refcount._0_4_;
      local_1d8.refcount._4_4_ = local_258.refcount._4_4_;
      local_1d8.elemsize._0_4_ = (undefined4)local_258.elemsize;
      local_1d8.elemsize._4_4_ = local_258.elemsize._4_4_;
      local_1d8.elempack = local_258.elempack;
      local_1d8.allocator = local_258.allocator;
      local_1d8.dims = local_258.dims;
      local_1d8.w = local_258.w;
      local_1d8.h = local_258.h;
      local_1d8.d = local_258.d;
      local_1d8.c = local_258.c;
      local_1d8.cstep = local_258.cstep;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            free(local_258.data);
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = local_180;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_1d8,local_180,opt);
      local_258.cstep = 0;
      local_258.data = (void *)0x0;
      local_258.refcount._0_4_ = 0;
      local_258.refcount._4_4_ = 0;
      local_258.elemsize._0_4_ = 0;
      local_258.elemsize._4_4_ = 0;
      local_258.elempack = 0;
      local_258.allocator = (Allocator *)0x0;
      local_258.dims = 0;
      local_258.w = 0;
      local_258.h = 0;
      local_258.d = 0;
      local_258.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_258,opt);
      Mat::reshape(&local_108,&local_258,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),
                   (Allocator *)0x0);
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + 1;
        UNLOCK();
      }
      piVar11 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            free(local_258.data);
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_258.data = local_108.data;
      local_258.refcount._0_4_ = SUB84(local_108.refcount,0);
      local_258.refcount._4_4_ = (undefined4)((ulong)local_108.refcount >> 0x20);
      local_258.elemsize._0_4_ = (undefined4)local_108.elemsize;
      local_258.elemsize._4_4_ = (undefined4)(local_108.elemsize >> 0x20);
      local_258.elempack = local_108.elempack;
      local_258.allocator = local_108.allocator;
      local_258.dims = local_108.dims;
      local_258.w = local_108.w;
      local_258.h = local_108.h;
      local_258.d = local_108.d;
      local_258.c = local_108.c;
      local_258.cstep = local_108.cstep;
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + -1;
        UNLOCK();
        if (*local_108.refcount == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            free(local_108.data);
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = (local_188->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar11 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      if (pMVar3 != &local_258) {
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + 1;
          UNLOCK();
        }
        piVar11 = pMVar3->refcount;
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              free(pMVar3->data);
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->c = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        piVar11 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
        pMVar3->data = local_258.data;
        pMVar3->refcount = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
        pMVar3->elemsize = CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize);
        pMVar3->elempack = local_258.elempack;
        pMVar3->allocator = local_258.allocator;
        pMVar3->dims = local_258.dims;
        pMVar3->w = local_258.w;
        pMVar3->h = local_258.h;
        pMVar3->d = local_258.d;
        pMVar3->c = local_258.c;
        pMVar3->cstep = local_258.cstep;
      }
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            free(local_258.data);
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_c0.refcount != (int *)0x0) {
        LOCK();
        *local_c0.refcount = *local_c0.refcount + -1;
        UNLOCK();
        if (*local_c0.refcount == 0) {
          if (local_c0.allocator == (Allocator *)0x0) {
            free(local_c0.data);
          }
          else {
            (*(local_c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar8 = 0;
    }
  }
  piVar11 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        free(local_1d8.data);
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int DeformableConv2D_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}